

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall dg::LLVMPointerAnalysis::~LLVMPointerAnalysis(LLVMPointerAnalysis *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR___cxa_pure_virtual_001906f8;
  LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions((LLVMPointerAnalysisOptions *)this);
  return;
}

Assistant:

virtual ~LLVMPointerAnalysis() = default;